

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O0

void NES_APU_np_Reset(void *chip)

{
  int local_1c;
  int i;
  NES_APU *apu;
  void *chip_local;
  
  *(undefined4 *)((long)chip + 0x2c) = 0;
  *(undefined4 *)((long)chip + 0x18) = 0;
  *(undefined4 *)((long)chip + 0xe0) = 0;
  *(undefined4 *)((long)chip + 0xe4) = 0;
  *(undefined4 *)((long)chip + 0xe8) = 0;
  *(undefined4 *)((long)chip + 0xe8) = 0;
  *(undefined4 *)((long)chip + 0x120) = 1;
  *(undefined4 *)((long)chip + 0x124) = 1;
  *(undefined4 *)((long)chip + 0x140) = 0;
  *(undefined4 *)((long)chip + 0x144) = 0;
  *(undefined4 *)((long)chip + 0x150) = 0;
  *(undefined4 *)((long)chip + 0x154) = 0;
  *(undefined4 *)((long)chip + 0x148) = 0;
  *(undefined4 *)((long)chip + 0x14c) = 0;
  for (local_1c = 0x4000; local_1c < 0x4008; local_1c = local_1c + 1) {
    NES_APU_np_Write(chip,(UINT16)local_1c,'\0');
  }
  NES_APU_np_Write(chip,0x4015,'\0');
  if (*(int *)((long)chip + 8) != 0) {
    NES_APU_np_Write(chip,0x4015,'\x0f');
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x50) = 0;
  }
  NES_APU_np_SetRate(chip,*(UINT32 *)((long)chip + 0x58));
  RC_RESET((RATIO_CNTR *)((long)chip + 0x160));
  return;
}

Assistant:

void NES_APU_np_Reset(void* chip)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;
	apu->gclock = 0;
	apu->mask = 0;

	apu->scounter[0] = 0;
	apu->scounter[1] = 0;
	apu->sphase[0] = 0;
	apu->sphase[0] = 0;

	apu->sweep_div[0] = 1;
	apu->sweep_div[1] = 1;
	apu->envelope_div[0] = 0;
	apu->envelope_div[1] = 0;
	apu->length_counter[0] = 0;
	apu->length_counter[1] = 0;
	apu->envelope_counter[0] = 0;
	apu->envelope_counter[1] = 0;

	for (i = 0x4000; i < 0x4008; i++)
		NES_APU_np_Write(apu, i, 0);

	NES_APU_np_Write(apu, 0x4015, 0);
	if (apu->option[OPT_UNMUTE_ON_RESET])
		NES_APU_np_Write(apu, 0x4015, 0x0f);

	for (i = 0; i < 2; i++)
		apu->out[i] = 0;

	NES_APU_np_SetRate(apu, apu->rate);
	RC_RESET(&apu->tick_count);
}